

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcSimulationDataGenerator::GenControlField
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcSimulationDataGenerator *this,HdlcFrameType frameType,HdlcControlType controlType,
          U8 value)

{
  pointer *ppuVar1;
  byte *__args;
  iterator iVar2;
  byte local_1a;
  byte local_19;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a = value;
  if (frameType == HDLC_U_FRAME) {
    local_19 = value | 3;
    __args = &local_19;
    iVar2._M_current = (uchar *)0x0;
    goto LAB_0010d5fc;
  }
  if (frameType == HDLC_S_FRAME) {
    local_19 = (value & 0xfc) + 1;
  }
  else {
    if (frameType != HDLC_I_FRAME) {
      return __return_storage_ptr__;
    }
    local_19 = value & 0xfe;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_realloc_insert<unsigned_char_const&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (iterator)0x0,&local_19);
  if (controlType == HDLC_EXTENDED_CONTROL_FIELD_MOD_128) {
LAB_0010d5e1:
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (controlType == HDLC_EXTENDED_CONTROL_FIELD_MOD_32768) {
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,&local_1a);
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar2._M_current = local_1a;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
      }
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,&local_1a);
        goto LAB_0010d5e1;
      }
    }
    else {
      if (controlType != HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648) {
        return __return_storage_ptr__;
      }
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,&local_1a);
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar2._M_current = local_1a;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
      }
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,&local_1a);
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar2._M_current = local_1a;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
      }
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,&local_1a);
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar2._M_current = local_1a;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
      }
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,&local_1a);
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar2._M_current = local_1a;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
      }
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,&local_1a);
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar2._M_current = local_1a;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
      }
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,&local_1a);
        goto LAB_0010d5e1;
      }
    }
    *iVar2._M_current = local_1a;
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current !=
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    *iVar2._M_current = local_1a;
    ppuVar1 = &(__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
    return __return_storage_ptr__;
  }
  __args = &local_1a;
LAB_0010d5fc:
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_realloc_insert<unsigned_char_const&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar2,
             __args);
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::GenControlField( HdlcFrameType frameType, HdlcControlType controlType, U8 value ) const
{
    vector<U8> controlRet;
    U8 ctrl;
    switch( frameType )
    {
    case HDLC_I_FRAME:
        ctrl = ( value & 0xFE ) | U8( frameType );
        break;
    case HDLC_S_FRAME:
        ctrl = ( value & 0xFC ) | U8( frameType );
        break;
    case HDLC_U_FRAME:
        ctrl = value | U8( HDLC_U_FRAME );
    }

    switch( frameType )
    {
    case HDLC_I_FRAME:
    case HDLC_S_FRAME:
    {
        // first byte
        controlRet.push_back( ctrl );
        switch( controlType )
        {
        case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
            controlRet.push_back( value ); // second byte
            break;
        case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
            controlRet.push_back( value ); // second byte
            controlRet.push_back( value ); // third byte
            controlRet.push_back( value ); // fourth byte
            break;
        case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
            controlRet.push_back( value ); // second byte
            controlRet.push_back( value ); // third byte
            controlRet.push_back( value ); // fourth byte
            controlRet.push_back( value ); // fifth byte
            controlRet.push_back( value ); // sixth byte
            controlRet.push_back( value ); // seventh byte
            controlRet.push_back( value ); // eighth byte
            break;
        }
        break;
    }
    case HDLC_U_FRAME: // U frames are always of 8 bits
    {
        controlRet.push_back( ctrl );
        break;
    }
    }
    return controlRet;
}